

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr c4::yml::normalize_tag(csubstr tag)

{
  YamlTag_e tag_00;
  size_t in_RDX;
  yml *this;
  csubstr tag_01;
  csubstr local_20;
  
  tag_01.str = (char *)tag.len;
  this = (yml *)tag.str;
  tag_01.len = in_RDX;
  tag_00 = to_tag(this,tag_01);
  if (tag_00 == TAG_NONE) {
    if ((((char *)0x1 < tag_01.str) && (*this == (yml)0x21)) && (this[1] == (yml)0x3c)) {
      basic_substring<const_char>::basic_substring
                (&local_20,(char *)(this + 1),(size_t)(tag_01.str + -1));
      tag = local_20;
    }
  }
  else {
    tag = from_tag(tag_00);
  }
  return tag;
}

Assistant:

csubstr normalize_tag(csubstr tag)
{
    YamlTag_e t = to_tag(tag);
    if(t != TAG_NONE)
        return from_tag(t);
    if(tag.begins_with("!<"))
        tag = tag.sub(1);
    if(tag.begins_with("<!"))
        return tag;
    return tag;
}